

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O1

void __thiscall rengine::SDLBackend::processEvents(SDLBackend *this)

{
  int iVar1;
  Type type;
  undefined1 local_58 [8];
  SDL_Event event;
  
  iVar1 = SDL_PollEvent(0);
  if (0 < iVar1) {
    iVar1 = iVar1 + 1;
    do {
      SDL_PollEvent((SDL_Event *)local_58);
      if ((int)local_58._0_4_ < 0x401) {
        if (local_58._0_4_ == 0x100) {
          (this->super_Backend).m_running = false;
        }
        else if (local_58._0_4_ == 0x400) {
          type = PointerMove;
          goto LAB_0011336d;
        }
      }
      else {
        if (local_58._0_4_ == 0x401) {
          type = PointerDown;
        }
        else {
          if (local_58._0_4_ != 0x402) {
            if (local_58._0_4_ == 0x8000) {
              this->m_renderRequested = false;
              (*this->m_surface->_vptr_Surface[2])();
            }
            goto LAB_00113378;
          }
          type = PointerUp;
        }
LAB_0011336d:
        sendPointerEvent(this,(SDL_Event *)local_58,type);
      }
LAB_00113378:
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  return;
}

Assistant:

inline void SDLBackend::processEvents()
{
    SDL_Event event;
    int evt = SDL_PollEvent(nullptr);

    // This odd-looking construct ensures we do not process events that are
    // pushed onto the queue after we start processing, so as to not starve the
    // main loop.
    while (evt-- > 0) {
        SDL_PollEvent(&event);

        switch (event.type) {
            case SDL_USEREVENT: {
                // reset this before onRender so we don't prevent onRender from
                // scheduling another one..
                m_renderRequested = false;
                m_surface->onRender();
                break;
            }
            case SDL_MOUSEBUTTONDOWN: {
                sendPointerEvent(&event, Event::PointerDown);
                break;
            }
            case SDL_MOUSEBUTTONUP: {
                sendPointerEvent(&event, Event::PointerUp);
                break;
            }
            case SDL_MOUSEMOTION: {
                sendPointerEvent(&event, Event::PointerMove);
                break;
            }
            case SDL_QUIT: {
                m_running = false;
                break;
            }
            default: {
                // logw << "unknown event.type " << event.type << std::endl;
            }
        }
    }
}